

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O2

wchar_t archive_compressor_compress_close(archive_write_filter *f)

{
  void *pvVar1;
  void *pvVar2;
  wchar_t wVar3;
  int iVar4;
  
  pvVar1 = f->data;
  wVar3 = output_code(f,*(wchar_t *)((long)pvVar1 + 0x65164));
  if (wVar3 != L'\0') {
    return wVar3;
  }
  pvVar2 = f->data;
  iVar4 = *(int *)((long)pvVar2 + 0x6516c) % 8;
  if (iVar4 != 0) {
    *(uint *)((long)pvVar2 + 0x18) = iVar4 + 7U >> 3;
    wVar3 = output_byte(f,*(uchar *)((long)pvVar2 + 0x65170));
    if (wVar3 != L'\0') {
      return wVar3;
    }
  }
  wVar3 = __archive_write_filter
                    (f->next_filter,*(void **)((long)pvVar1 + 0x65178),
                     *(size_t *)((long)pvVar1 + 0x65188));
  return wVar3;
}

Assistant:

static int
archive_compressor_compress_close(struct archive_write_filter *f)
{
	struct private_data *state = (struct private_data *)f->data;
	int ret;

	ret = output_code(f, state->cur_code);
	if (ret != ARCHIVE_OK)
		return ret;
	ret = output_flush(f);
	if (ret != ARCHIVE_OK)
		return ret;

	/* Write the last block */
	ret = __archive_write_filter(f->next_filter,
	    state->compressed, state->compressed_offset);
	return (ret);
}